

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O0

any * __thiscall hwnet::any::operator=(any *this,any *rhs)

{
  any *rhs_local;
  any *this_local;
  
  if (rhs != this) {
    _destroy(this);
    if ((rhs->counter == (int *)0x0) || (rhs->content == (placeholder *)0x0)) {
      this->content = (placeholder *)0x0;
    }
    else {
      this->content = rhs->content;
      this->counter = rhs->counter;
      *this->counter = *this->counter + 1;
    }
  }
  return this;
}

Assistant:

any & operator=(const any & rhs)
	{
		if(&rhs == this)
			return *this;
		else
		{      
			_destroy();
			if(rhs.counter && rhs.content)
			{
				content = rhs.content;
				counter = rhs.counter;
				++(*counter);
			}
			else
			{
				content = nullptr;
			}
			return *this;
		}
	}